

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void us_internal_socket_context_unlink(us_socket_context_t *context,us_socket_t *s)

{
  us_socket_t *puVar1;
  us_socket_t *puVar2;
  
  puVar2 = s->next;
  if (context->iterator == s) {
    context->iterator = puVar2;
  }
  puVar1 = s->prev;
  if (puVar1 == puVar2) {
    context->head = (us_socket_t *)0x0;
  }
  else {
    if (puVar1 == (us_socket_t *)0x0) {
      context->head = puVar2;
    }
    else {
      puVar1->next = puVar2;
      puVar2 = s->next;
    }
    if (puVar2 != (us_socket_t *)0x0) {
      puVar2->prev = puVar1;
      return;
    }
  }
  return;
}

Assistant:

void us_internal_socket_context_unlink(struct us_socket_context_t *context, struct us_socket_t *s) {
    /* We have to properly update the iterator used to sweep sockets for timeouts */
    if (s == context->iterator) {
        context->iterator = s->next;
    }

    if (s->prev == s->next) {
        context->head = 0;
    } else {
        if (s->prev) {
            s->prev->next = s->next;
        } else {
            context->head = s->next;
        }
        if (s->next) {
            s->next->prev = s->prev;
        }
    }
}